

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O0

h__Writer * __thiscall
AS_02::PCM::MXFWriter::h__Writer::OpenWrite
          (h__Writer *this,string *filename,FileDescriptor *essence_descriptor,
          InterchangeObject_list_t *essence_sub_descriptor_list,ui32_t *header_size)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ILogSink *pIVar4;
  char *__s;
  reference ppIVar5;
  byte_t *pbVar6;
  undefined4 *in_R9;
  bool local_22a;
  undefined8 local_200;
  h__WriterState local_1d8 [27];
  byte local_169;
  Identifier<16U> local_168;
  byte local_141;
  Identifier<16U> local_140;
  byte local_119;
  Identifier<16U> local_118;
  byte local_f1;
  Identifier<16U> local_f0;
  Identifier<16U> local_d0;
  Identifier<16U> local_b0;
  _Self local_90;
  _List_node_base *local_88;
  _List_iterator<ASDCP::MXF::InterchangeObject_*> local_80;
  iterator i;
  allocator<char> local_61;
  string local_60 [39];
  undefined1 local_39;
  undefined4 *local_38;
  ui32_t *header_size_local;
  InterchangeObject_list_t *essence_sub_descriptor_list_local;
  FileDescriptor *essence_descriptor_local;
  string *filename_local;
  h__Writer *this_local;
  Result_t *result;
  
  header_size_local = header_size;
  essence_sub_descriptor_list_local = essence_sub_descriptor_list;
  essence_descriptor_local = essence_descriptor;
  filename_local = filename;
  this_local = this;
  if (essence_sub_descriptor_list == (InterchangeObject_list_t *)0x0) {
    __assert_fail("essence_descriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                  ,0x167,
                  "ASDCP::Result_t AS_02::PCM::MXFWriter::h__Writer::OpenWrite(const std::string &, ASDCP::MXF::FileDescriptor *, ASDCP::MXF::InterchangeObject_list_t &, const ui32_t &)"
                 );
  }
  local_38 = in_R9;
  if (essence_sub_descriptor_list == (InterchangeObject_list_t *)0x0) {
    local_200 = 0;
  }
  else {
    local_200 = __dynamic_cast(essence_sub_descriptor_list,&ASDCP::MXF::FileDescriptor::typeinfo,
                               &ASDCP::MXF::WaveAudioDescriptor::typeinfo,0);
  }
  *(undefined8 *)(filename + 0x2e) = local_200;
  if (*(long *)(filename + 0x2e) == 0) {
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar4,"Essence descriptor is not a WaveAudioDescriptor.\n");
    (*(code *)(essence_sub_descriptor_list_local->
              super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              )._M_impl._M_node.super__List_node_base._M_next[8]._M_prev)
              (essence_sub_descriptor_list_local,0);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
  }
  else {
    bVar2 = ASDCP::MXF::h__WriterState::Test_BEGIN((h__WriterState *)&filename[0x1b].field_2);
    if (bVar2) {
      local_39 = 0;
      __s = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_60,__s,&local_61);
      Kumu::FileWriter::OpenWrite((string *)this);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator(&local_61);
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (-1 < iVar3) {
        *(undefined4 *)&filename[2]._M_string_length = *local_38;
        *(InterchangeObject_list_t **)((long)&filename[0x18].field_2 + 8) =
             essence_sub_descriptor_list_local;
        ASDCP::MXF::Rational::operator=
                  ((Rational *)(*(long *)(filename + 0x2e) + 0xe8),
                   (Rational *)(*(long *)(filename + 0x2e) + 0x150));
        std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::_List_iterator(&local_80);
        local_88 = (_List_node_base *)
                   std::__cxx11::
                   list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                   ::begin((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                            *)header_size_local);
        local_80._M_node = local_88;
        while( true ) {
          local_90._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
               ::end((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                      *)header_size_local);
          bVar2 = std::operator!=(&local_80,&local_90);
          if (!bVar2) break;
          ppIVar5 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_80);
          local_f1 = 0;
          local_119 = 0;
          local_141 = 0;
          local_169 = 0;
          (**(code **)(*(long *)*ppIVar5 + 0x10))(&local_b0);
          pbVar6 = ASDCP::Dictionary::ul
                             ((Dictionary *)filename->_M_string_length,
                              MDD_AudioChannelLabelSubDescriptor);
          ASDCP::UL::UL((UL *)&local_d0,pbVar6);
          bVar2 = Kumu::Identifier<16U>::operator!=(&local_b0,&local_d0);
          local_22a = false;
          if (bVar2) {
            ppIVar5 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_80);
            (**(code **)(*(long *)*ppIVar5 + 0x10))(&local_f0);
            local_f1 = 1;
            pbVar6 = ASDCP::Dictionary::ul
                               ((Dictionary *)filename->_M_string_length,
                                MDD_SoundfieldGroupLabelSubDescriptor);
            ASDCP::UL::UL((UL *)&local_118,pbVar6);
            local_119 = 1;
            bVar2 = Kumu::Identifier<16U>::operator!=(&local_f0,&local_118);
            local_22a = false;
            if (bVar2) {
              ppIVar5 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_80);
              (**(code **)(*(long *)*ppIVar5 + 0x10))(&local_140);
              local_141 = 1;
              pbVar6 = ASDCP::Dictionary::ul
                                 ((Dictionary *)filename->_M_string_length,
                                  MDD_GroupOfSoundfieldGroupsLabelSubDescriptor);
              ASDCP::UL::UL((UL *)&local_168,pbVar6);
              local_169 = 1;
              local_22a = Kumu::Identifier<16U>::operator!=(&local_140,&local_168);
            }
          }
          if ((local_169 & 1) != 0) {
            ASDCP::UL::~UL((UL *)&local_168);
          }
          if ((local_141 & 1) != 0) {
            ASDCP::UL::~UL((UL *)&local_140);
          }
          if ((local_119 & 1) != 0) {
            ASDCP::UL::~UL((UL *)&local_118);
          }
          if ((local_f1 & 1) != 0) {
            ASDCP::UL::~UL((UL *)&local_f0);
          }
          ASDCP::UL::~UL((UL *)&local_d0);
          ASDCP::UL::~UL((UL *)&local_b0);
          if (local_22a != false) {
            pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
            Kumu::ILogSink::Error
                      (pIVar4,"Essence sub-descriptor is not an MCALabelSubDescriptor.\n");
            ppIVar5 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_80);
            (**(code **)(*(long *)*ppIVar5 + 0x88))(*ppIVar5,0);
          }
          ppIVar5 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_80);
          std::__cxx11::
          list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
          push_back((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                     *)(filename + 0x19),ppIVar5);
          ppIVar5 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_80);
          Kumu::GenRandomValue((UUID *)(*ppIVar5 + 0x58));
          lVar1 = *(long *)((long)&filename[0x18].field_2 + 8);
          ppIVar5 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_80);
          std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
                    ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)(lVar1 + 200),
                     (value_type *)(*ppIVar5 + 0x58));
          ppIVar5 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_80);
          *ppIVar5 = (InterchangeObject *)0x0;
          std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_80);
        }
        ASDCP::MXF::h__WriterState::Goto_INIT(local_1d8);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_1d8);
        Kumu::Result_t::~Result_t((Result_t *)local_1d8);
      }
    }
    else {
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::h__Writer::OpenWrite(const std::string& filename, ASDCP::MXF::FileDescriptor* essence_descriptor,
					    ASDCP::MXF::InterchangeObject_list_t& essence_sub_descriptor_list, const ui32_t& header_size)
{
  assert(essence_descriptor);

  m_WaveAudioDescriptor = dynamic_cast<ASDCP::MXF::WaveAudioDescriptor*>(essence_descriptor);

  if ( m_WaveAudioDescriptor == 0 )
    {
      DefaultLogSink().Error("Essence descriptor is not a WaveAudioDescriptor.\n");
      essence_descriptor->Dump();
      return RESULT_AS02_FORMAT;
    }

  if ( ! m_State.Test_BEGIN() )
    {
      return RESULT_STATE;
    }

  Result_t result = m_File.OpenWrite(filename.c_str());

  if ( KM_SUCCESS(result) )
    {
      m_HeaderSize = header_size;
      m_EssenceDescriptor = essence_descriptor;
      m_WaveAudioDescriptor->SampleRate = m_WaveAudioDescriptor->AudioSamplingRate;

      ASDCP::MXF::InterchangeObject_list_t::iterator i;
      for ( i = essence_sub_descriptor_list.begin(); i != essence_sub_descriptor_list.end(); ++i )
	{
	  if ( (*i)->GetUL() != UL(m_Dict->ul(MDD_AudioChannelLabelSubDescriptor))
	       && (*i)->GetUL() != UL(m_Dict->ul(MDD_SoundfieldGroupLabelSubDescriptor))
	       && (*i)->GetUL() != UL(m_Dict->ul(MDD_GroupOfSoundfieldGroupsLabelSubDescriptor)) )
	    {
	      DefaultLogSink().Error("Essence sub-descriptor is not an MCALabelSubDescriptor.\n");
	      (*i)->Dump();
	    }

	  m_EssenceSubDescriptorList.push_back(*i);
	  GenRandomValue((*i)->InstanceUID);
	  m_EssenceDescriptor->SubDescriptors.push_back((*i)->InstanceUID);
	  *i = 0; // parent will only free the ones we don't keep
	}

      result = m_State.Goto_INIT();
    }

  return result;
}